

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.c
# Opt level: O2

int cmd_load(char *arg)

{
  size_t sVar1;
  char *__ptr;
  char *pcVar2;
  char *pcVar3;
  long lVar4;
  int iVar5;
  char *pcVar6;
  
  sVar1 = strlen(arg);
  if (sVar1 < 6) {
    cmd_load_help();
    return 1;
  }
  __ptr = strdup(arg + 4);
  pcVar6 = __ptr;
  while (pcVar2 = strstr(pcVar6,"-i"), pcVar2 != (char *)0x0) {
    pcVar6 = pcVar2 + 2;
    if ((pcVar2[2] & 0xdfU) == 0) {
      ly_ctx_set_allimplemented(ctx);
      pcVar2[0] = ' ';
      pcVar2[1] = ' ';
    }
  }
  pcVar2 = __ptr + -1;
  pcVar6 = pcVar2;
  do {
    pcVar2 = pcVar2 + 1;
    pcVar3 = pcVar6 + 1;
    pcVar6 = pcVar6 + 1;
  } while (*pcVar3 == ' ');
  pcVar3 = strchr(pcVar6,0x20);
  if (pcVar3 == (char *)0x0) {
    sVar1 = strlen(pcVar6);
  }
  else {
    sVar1 = (long)pcVar3 - (long)pcVar2;
  }
  do {
    pcVar2 = strndup(pcVar6,(long)(int)sVar1);
    do {
      if (pcVar2 == (char *)0x0) {
        iVar5 = 0;
LAB_00106fc2:
        free(__ptr);
        ly_ctx_unset_allimplemented(ctx);
        return iVar5;
      }
      lVar4 = ly_ctx_load_module(ctx,pcVar2,0);
      free(pcVar2);
      if (lVar4 == 0) {
        iVar5 = 1;
        goto LAB_00106fc2;
      }
      pcVar2 = pcVar6 + (long)(int)sVar1 + -1;
      pcVar6 = pcVar2;
      do {
        pcVar2 = pcVar2 + 1;
        pcVar3 = pcVar6 + 1;
        pcVar6 = pcVar6 + 1;
      } while (*pcVar3 == ' ');
      pcVar3 = strchr(pcVar6,0x20);
      if (pcVar3 == (char *)0x0) {
        sVar1 = strlen(pcVar6);
      }
      else {
        sVar1 = (long)pcVar3 - (long)pcVar2;
      }
      pcVar2 = (char *)0x0;
    } while ((int)sVar1 == 0);
  } while( true );
}

Assistant:

int
cmd_load(const char *arg)
{
    int name_len, ret = 1;
    char *name, *s, *arg_ptr;
    const struct lys_module *model;

    if (strlen(arg) < 6) {
        cmd_load_help();
        return 1;
    }

    arg_ptr = strdup(arg + 4 /* ignore "load" */);

    for (s = strstr(arg_ptr, "-i"); s ; s = strstr(s + 2, "-i")) {
        if (s[2] == '\0' || s[2] == ' ') {
            ly_ctx_set_allimplemented(ctx);
            s[0] = s[1] = ' ';
        }
    }
    s = arg_ptr;

    while (arg_ptr[0] == ' ') {
        ++arg_ptr;
    }
    if (strchr(arg_ptr, ' ')) {
        name_len = strchr(arg_ptr, ' ') - arg_ptr;
    } else {
        name_len = strlen(arg_ptr);
    }
    name = strndup(arg_ptr, name_len);

    while (name) {
        model = ly_ctx_load_module(ctx, name, NULL);
        free(name);
        if (!model) {
            /* libyang printed the error messages */
            goto cleanup;
        }

        /* next model */
        arg_ptr += name_len;
        while (arg_ptr[0] == ' ') {
            ++arg_ptr;
        }
        if (strchr(arg_ptr, ' ')) {
            name_len = strchr(arg_ptr, ' ') - arg_ptr;
        } else {
            name_len = strlen(arg_ptr);
        }

        if (name_len) {
            name = strndup(arg_ptr, name_len);
        } else {
            name = NULL;
        }
    }
    ret = 0;

cleanup:
    free(s);
    ly_ctx_unset_allimplemented(ctx);

    return ret;
}